

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QXmlStreamAttribute>::emplace<QXmlStreamAttribute>
          (QMovableArrayOps<QXmlStreamAttribute> *this,qsizetype i,QXmlStreamAttribute *args)

{
  bool bVar1;
  qsizetype qVar2;
  QXmlStreamAttribute *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QXmlStreamAttribute tmp;
  QXmlStreamAttribute *in_stack_ffffffffffffff18;
  QXmlStreamAttribute *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff3c;
  QArrayDataPointer<QXmlStreamAttribute> *in_stack_ffffffffffffff40;
  Inserter local_98;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QXmlStreamAttribute>::needsDetach
                    ((QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff20);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QXmlStreamAttribute>::freeSpaceAtEnd
                          ((QArrayDataPointer<QXmlStreamAttribute> *)
                           CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)),
       qVar2 != 0)) {
      QArrayDataPointer<QXmlStreamAttribute>::end
                ((QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff20);
      QXmlStreamAttribute::QXmlStreamAttribute(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_RDI->displaceTo =
           (QXmlStreamAttribute *)((long)&(in_RDI->displaceTo->m_name).m_string.d + 1);
      goto LAB_00662559;
    }
    if ((in_RSI == (QXmlStreamAttribute *)0x0) &&
       (qVar2 = QArrayDataPointer<QXmlStreamAttribute>::freeSpaceAtBegin
                          ((QArrayDataPointer<QXmlStreamAttribute> *)
                           CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)),
       qVar2 != 0)) {
      QArrayDataPointer<QXmlStreamAttribute>::begin
                ((QArrayDataPointer<QXmlStreamAttribute> *)0x6623fa);
      QXmlStreamAttribute::QXmlStreamAttribute(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo =
           (QXmlStreamAttribute *)((long)&(in_RDI->displaceTo->m_name).m_string.d + 1);
      goto LAB_00662559;
    }
  }
  memset(local_70,0xaa,0x68);
  QXmlStreamAttribute::QXmlStreamAttribute(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar1 = in_RDI->displaceTo != (QXmlStreamAttribute *)0x0;
  uVar3 = bVar1 && in_RSI == (QXmlStreamAttribute *)0x0;
  QArrayDataPointer<QXmlStreamAttribute>::detachAndGrow
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(qsizetype)in_RDI,
             (QXmlStreamAttribute **)CONCAT17(uVar3,in_stack_ffffffffffffff28),
             (QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff20);
  if (bVar1 && in_RSI == (QXmlStreamAttribute *)0x0) {
    QArrayDataPointer<QXmlStreamAttribute>::begin
              ((QArrayDataPointer<QXmlStreamAttribute> *)0x6624b5);
    QXmlStreamAttribute::QXmlStreamAttribute(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QXmlStreamAttribute *)((long)&(in_RDI->displaceTo->m_name).m_string.d + 1)
    ;
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QXmlStreamAttribute> *)
                              CONCAT17(uVar3,in_stack_ffffffffffffff28),
                       (qsizetype)in_stack_ffffffffffffff20,(qsizetype)in_stack_ffffffffffffff18);
    Inserter::insertOne((Inserter *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    Inserter::~Inserter(&local_98);
  }
  QXmlStreamAttribute::~QXmlStreamAttribute(in_stack_ffffffffffffff20);
LAB_00662559:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }